

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Group_Type.cxx
# Opt level: O2

void __thiscall Fl_Scroll_Type::copy_properties(Fl_Scroll_Type *this)

{
  Fl_Widget *this_00;
  Fl_Widget *pFVar1;
  
  Fl_Widget_Type::copy_properties((Fl_Widget_Type *)this);
  this_00 = (this->super_Fl_Group_Type).super_Fl_Widget_Type.live_widget;
  pFVar1 = (this->super_Fl_Group_Type).super_Fl_Widget_Type.o;
  Fl_Widget::position(this_00,pFVar1[1].w_,pFVar1[1].h_);
  this_00->type_ = pFVar1->type_;
  *(undefined4 *)((long)&this_00[2].user_data_ + 4) =
       *(undefined4 *)((long)&pFVar1[2].user_data_ + 4);
  *(undefined4 *)&this_00[3].label_.field_0x2c = *(undefined4 *)&pFVar1[3].label_.field_0x2c;
  return;
}

Assistant:

void Fl_Scroll_Type::copy_properties() {
  Fl_Group_Type::copy_properties();
  Fl_Scroll *s = (Fl_Scroll*)o, *d = (Fl_Scroll*)live_widget;
  d->position(s->xposition(), s->yposition());
  d->type(s->type()); // TODO: get this flag from Fl_Scroll_Type!
  d->scrollbar.align(s->scrollbar.align());
  d->hscrollbar.align(s->hscrollbar.align());
}